

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinitions.cxx
# Opt level: O0

void __thiscall cmDefinitions::Unset(cmDefinitions *this,string *key)

{
  mapped_type *this_00;
  String local_58;
  Def local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *key_local;
  cmDefinitions *this_local;
  
  local_38.Value.view_._M_len = 0;
  local_38.Value.view_._M_str = (char *)0x0;
  local_38.Value.string_.
  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_38.Value.string_.
  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_18 = key;
  key_local = (string *)this;
  Def::Def(&local_38);
  ::cm::String::String<std::__cxx11::string_const&,void>(&local_58,local_18);
  this_00 = std::
            unordered_map<cm::String,_cmDefinitions::Def,_std::hash<cm::String>,_std::equal_to<cm::String>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>_>
            ::operator[](&this->Map,&local_58);
  Def::operator=(this_00,&local_38);
  ::cm::String::~String(&local_58);
  Def::~Def(&local_38);
  return;
}

Assistant:

void cmDefinitions::Unset(const std::string& key)
{
  this->Map[key] = Def();
}